

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ColorPickerOptionsPopup(float *ref_col,ImGuiColorEditFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  int int_id;
  uint flags_00;
  float item_width;
  float fVar6;
  ImVec2 backup_pos;
  ImVec2 picker_size;
  ImVec2 local_50;
  ImVec2 local_48;
  float local_40 [3];
  undefined1 auStack_34 [4];
  
  if ((flags & 0x6000000U) != 0 && (flags & 0x10002U) != 0) {
    return;
  }
  bVar2 = BeginPopup("context",0);
  pIVar1 = GImGui;
  if (!bVar2) {
    return;
  }
  if ((flags & 0x6000000U) == 0) {
    item_width = GImGui->FontSize * 8.0;
    fVar6 = GetFrameHeight();
    local_48.y = item_width - (fVar6 + (pIVar1->Style).ItemInnerSpacing.x);
    if (local_48.y <= 1.0) {
      local_48.y = 1.0;
    }
    local_48.x = item_width;
    PushItemWidth(item_width);
    bVar2 = false;
    iVar5 = 1;
    int_id = 0;
    do {
      if ((bVar2) && (GImGui->CurrentWindow->SkipItems == false)) {
        SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
      }
      PushID(int_id);
      cVar4 = (char)iVar5;
      flags_00 = (uint)bVar2 * 0x4000000 + (iVar5 << 0x19 | flags & 2U) + 0x1a8;
      local_50 = GetCursorScreenPos();
      bVar2 = Selectable("##selectable",false,0,&local_48);
      if (bVar2) {
        pIVar1->ColorEditOptions = flags_00 & 0x6000000 | pIVar1->ColorEditOptions & 0xf9ffffffU;
      }
      SetCursorScreenPos(&local_50);
      uVar3 = (ulong)((flags_00 & 2) == 0);
      memset(auStack_34 + uVar3 * 4,0,(ulong)((flags_00 & 2) * 2));
      memcpy(local_40,ref_col,uVar3 * 4 + 0xc);
      ColorPicker4("##previewing_picker",local_40,flags_00,(float *)0x0);
      PopID();
      int_id = 1;
      bVar2 = true;
      iVar5 = 0;
    } while (cVar4 != '\0');
    PopItemWidth();
    if ((flags & 0x10002U) != 0) goto LAB_001603a3;
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
  }
  else if ((flags & 0x10002U) != 0) goto LAB_001603a3;
  CheckboxFlagsT<int>("Alpha Bar",&pIVar1->ColorEditOptions,0x10000);
LAB_001603a3:
  EndPopup();
  return;
}

Assistant:

void ImGui::ColorPickerOptionsPopup(const float* ref_col, ImGuiColorEditFlags flags)
{
    bool allow_opt_picker = !(flags & ImGuiColorEditFlags__PickerMask);
    bool allow_opt_alpha_bar = !(flags & ImGuiColorEditFlags_NoAlpha) && !(flags & ImGuiColorEditFlags_AlphaBar);
    if ((!allow_opt_picker && !allow_opt_alpha_bar) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    if (allow_opt_picker)
    {
        ImVec2 picker_size(g.FontSize * 8, ImMax(g.FontSize * 8 - (GetFrameHeight() + g.Style.ItemInnerSpacing.x), 1.0f)); // FIXME: Picker size copied from main picker function
        PushItemWidth(picker_size.x);
        for (int picker_type = 0; picker_type < 2; picker_type++)
        {
            // Draw small/thumbnail version of each picker type (over an invisible button for selection)
            if (picker_type > 0) Separator();
            PushID(picker_type);
            ImGuiColorEditFlags picker_flags = ImGuiColorEditFlags_NoInputs | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_NoSidePreview | (flags & ImGuiColorEditFlags_NoAlpha);
            if (picker_type == 0) picker_flags |= ImGuiColorEditFlags_PickerHueBar;
            if (picker_type == 1) picker_flags |= ImGuiColorEditFlags_PickerHueWheel;
            ImVec2 backup_pos = GetCursorScreenPos();
            if (Selectable("##selectable", false, 0, picker_size)) // By default, Selectable() is closing popup
                g.ColorEditOptions = (g.ColorEditOptions & ~ImGuiColorEditFlags__PickerMask) | (picker_flags & ImGuiColorEditFlags__PickerMask);
            SetCursorScreenPos(backup_pos);
            ImVec4 previewing_ref_col;
            memcpy(&previewing_ref_col, ref_col, sizeof(float) * ((picker_flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4));
            ColorPicker4("##previewing_picker", &previewing_ref_col.x, picker_flags);
            PopID();
        }
        PopItemWidth();
    }
    if (allow_opt_alpha_bar)
    {
        if (allow_opt_picker) Separator();
        CheckboxFlags("Alpha Bar", &g.ColorEditOptions, ImGuiColorEditFlags_AlphaBar);
    }
    EndPopup();
}